

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP5Writer::InitParameters(BP5Writer *this)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint v_1;
  uint uVar5;
  ulong uVar6;
  uint v;
  uint v_2;
  uint uVar7;
  bool bVar8;
  
  BP5Engine::ParseParams
            (&this->super_BP5Engine,(this->super_Engine).m_IO,&(this->super_BP5Engine).m_Parameters)
  ;
  bVar8 = (this->super_BP5Engine).m_Parameters.BurstBufferPath._M_string_length != 0;
  this->m_WriteToBB = bVar8;
  bVar4 = (this->super_BP5Engine).m_Parameters.BurstBufferDrain;
  if (!bVar8) {
    bVar4 = false;
  }
  this->m_DrainBB = bVar4;
  uVar2 = helper::Comm::Size(&(this->super_Engine).m_Comm);
  uVar3 = (this->super_BP5Engine).m_Parameters.NumAggregators;
  if (uVar2 <= uVar3) {
    uVar3 = uVar2;
  }
  uVar7 = (this->super_BP5Engine).m_Parameters.AggregatorRatio;
  (this->super_BP5Engine).m_Parameters.NumAggregators = uVar3;
  uVar5 = (this->super_BP5Engine).m_Parameters.NumSubFiles;
  if (uVar2 <= uVar5) {
    uVar5 = uVar2;
  }
  (this->super_BP5Engine).m_Parameters.NumSubFiles = uVar5;
  if (uVar2 <= uVar7) {
    uVar7 = uVar2;
  }
  (this->super_BP5Engine).m_Parameters.AggregatorRatio = uVar7;
  if (uVar3 == 0) {
    if (uVar7 == 0) {
      uVar3 = uVar5;
      if (uVar5 == 0) goto LAB_0048211a;
    }
    else {
      uVar3 = uVar2 / uVar7;
    }
    (this->super_BP5Engine).m_Parameters.NumAggregators = uVar3;
  }
LAB_0048211a:
  uVar3 = (this->super_BP5Engine).m_Parameters.NumAggregators;
  uVar2 = (this->super_BP5Engine).m_Parameters.StripeSize;
  if (uVar5 < uVar3) {
    uVar3 = uVar5;
  }
  uVar7 = 0x4000000;
  if (uVar2 < 0x4000000) {
    uVar7 = uVar2;
  }
  uVar5 = 0x1000;
  if (uVar2 != 0) {
    uVar5 = uVar7;
  }
  (this->super_BP5Engine).m_Parameters.NumSubFiles = uVar3;
  (this->super_BP5Engine).m_Parameters.StripeSize = uVar5;
  if ((this->super_BP5Engine).m_Parameters.DirectIO == true) {
    if ((this->super_BP5Engine).m_Parameters.DirectIOAlignBuffer == 0) {
      (this->super_BP5Engine).m_Parameters.DirectIOAlignBuffer =
           (this->super_BP5Engine).m_Parameters.DirectIOAlignOffset;
    }
    uVar3 = (this->super_BP5Engine).m_Parameters.DirectIOAlignOffset;
    uVar6 = (ulong)uVar3;
    uVar2 = (this->super_BP5Engine).m_Parameters.DirectIOAlignBuffer;
    (this->m_BP5Serializer).m_BufferBlockSize = uVar6;
    (this->m_BP5Serializer).m_BufferAlign = (ulong)uVar2;
    if (uVar5 % uVar3 != 0) {
      (this->super_BP5Engine).m_Parameters.StripeSize = (uVar5 / uVar3 + 1) * uVar3;
    }
    uVar1 = (this->super_BP5Engine).m_Parameters.BufferChunkSize;
    if (uVar1 % uVar6 != 0) {
      (this->super_BP5Engine).m_Parameters.BufferChunkSize = (uVar1 / uVar6 + 1) * uVar6;
    }
  }
  (this->m_BP5Serializer).m_StatsLevel = (this->super_BP5Engine).m_Parameters.StatsLevel;
  return;
}

Assistant:

void BP5Writer::InitParameters()
{
    ParseParams(m_IO, m_Parameters);
    m_WriteToBB = !(m_Parameters.BurstBufferPath.empty());
    m_DrainBB = m_WriteToBB && m_Parameters.BurstBufferDrain;

    unsigned int nproc = (unsigned int)m_Comm.Size();
    m_Parameters.NumAggregators = helper::SetWithinLimit(m_Parameters.NumAggregators, 0U, nproc);
    m_Parameters.NumSubFiles = helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, nproc);
    m_Parameters.AggregatorRatio = helper::SetWithinLimit(m_Parameters.AggregatorRatio, 0U, nproc);
    if (m_Parameters.NumAggregators == 0)
    {
        if (m_Parameters.AggregatorRatio > 0)
        {
            m_Parameters.NumAggregators =
                helper::SetWithinLimit(nproc / m_Parameters.AggregatorRatio, 0U, nproc);
        }
        else if (m_Parameters.NumSubFiles > 0)
        {
            m_Parameters.NumAggregators =
                helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, nproc);
        }
    }
    m_Parameters.NumSubFiles =
        helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, m_Parameters.NumAggregators);

    // Limiting to max 64MB page size
    m_Parameters.StripeSize = helper::SetWithinLimit(m_Parameters.StripeSize, 0U, 67108864U);
    if (m_Parameters.StripeSize == 0)
    {
        m_Parameters.StripeSize = 4096;
    }

    if (m_Parameters.DirectIO)
    {
        if (m_Parameters.DirectIOAlignBuffer == 0)
        {
            m_Parameters.DirectIOAlignBuffer = m_Parameters.DirectIOAlignOffset;
        }
        m_BP5Serializer.m_BufferBlockSize = m_Parameters.DirectIOAlignOffset;
        m_BP5Serializer.m_BufferAlign = m_Parameters.DirectIOAlignBuffer;
        if (m_Parameters.StripeSize % m_Parameters.DirectIOAlignOffset)
        {
            size_t k = m_Parameters.StripeSize / m_Parameters.DirectIOAlignOffset + 1;
            m_Parameters.StripeSize = (unsigned int)(k * m_Parameters.DirectIOAlignOffset);
        }
        if (m_Parameters.BufferChunkSize % m_Parameters.DirectIOAlignOffset)
        {
            size_t k = m_Parameters.BufferChunkSize / m_Parameters.DirectIOAlignOffset + 1;
            m_Parameters.BufferChunkSize = k * m_Parameters.DirectIOAlignOffset;
        }
    }

    m_BP5Serializer.m_StatsLevel = m_Parameters.StatsLevel;
}